

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::analysis::ConstantManager::BuildInstructionAndAddToModule
          (ConstantManager *this,Constant *new_const,inst_iterator *pos,uint32_t type_id)

{
  bool bVar1;
  IRContext *pIVar2;
  DefUseManager *this_00;
  iterator local_50;
  ConstantManager *local_48;
  Instruction *new_inst_ptr;
  undefined1 local_38 [8];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  uint32_t new_id;
  uint32_t type_id_local;
  inst_iterator *pos_local;
  Constant *new_const_local;
  ConstantManager *this_local;
  
  new_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = type_id;
  pIVar2 = context(this);
  new_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
       IRContext::TakeNextId(pIVar2);
  if ((uint32_t)
      new_inst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl == 0) {
    this_local = (ConstantManager *)0x0;
  }
  else {
    CreateInstruction((ConstantManager *)local_38,(uint32_t)this,
                      (Constant *)
                      (ulong)(uint32_t)
                             new_inst._M_t.
                             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                             _M_head_impl,(uint32_t)new_const);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_38);
    if (bVar1) {
      local_48 = (ConstantManager *)
                 std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::get((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        *)local_38);
      InstructionList::iterator::InsertBefore
                (&local_50,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)pos);
      InstructionList::iterator::operator=(pos,&local_50);
      InstructionList::iterator::operator++(pos);
      pIVar2 = context(this);
      bVar1 = IRContext::AreAnalysesValid(pIVar2,kAnalysisBegin);
      if (bVar1) {
        pIVar2 = context(this);
        this_00 = IRContext::get_def_use_mgr(pIVar2);
        DefUseManager::AnalyzeInstDefUse(this_00,(Instruction *)local_48);
      }
      MapConstantToInst(this,new_const,(Instruction *)local_48);
      this_local = local_48;
    }
    else {
      this_local = (ConstantManager *)0x0;
    }
    new_inst_ptr._4_4_ = 1;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)local_38);
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* ConstantManager::BuildInstructionAndAddToModule(
    const Constant* new_const, Module::inst_iterator* pos, uint32_t type_id) {
  // TODO(1841): Handle id overflow.
  uint32_t new_id = context()->TakeNextId();
  if (new_id == 0) {
    return nullptr;
  }

  auto new_inst = CreateInstruction(new_id, new_const, type_id);
  if (!new_inst) {
    return nullptr;
  }
  auto* new_inst_ptr = new_inst.get();
  *pos = pos->InsertBefore(std::move(new_inst));
  ++(*pos);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(new_inst_ptr);
  MapConstantToInst(new_const, new_inst_ptr);
  return new_inst_ptr;
}